

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  size_t nbBytes;
  BIT_CStream_t *bitC_local;
  
  uVar1 = bitC->bitPos >> 3;
  MEM_writeLEST(bitC->ptr,bitC->bitContainer);
  bitC->ptr = bitC->ptr + uVar1;
  if (bitC->endPtr < bitC->ptr) {
    bitC->ptr = bitC->endPtr;
  }
  bitC->bitPos = bitC->bitPos & 7;
  bitC->bitContainer = bitC->bitContainer >> (((byte)uVar1 & 7) << 3);
  return;
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}